

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

mz_bool tinyexr::miniz::tdefl_compress_block(tdefl_compressor *d,mz_bool static_block)

{
  mz_uint16 (*pamVar1) [288];
  mz_uint16 *pmVar2;
  mz_uint16 *pmVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  mz_uint8 *pmVar7;
  uint uVar8;
  ushort uVar9;
  byte *pbVar10;
  mz_uint8 (*pamVar11) [288];
  mz_uint16 (*pamVar12) [288];
  long lVar13;
  undefined1 *puVar14;
  mz_uint16 *pmVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  long lVar19;
  mz_uint8 *pmVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  byte *pbVar25;
  char cVar26;
  uint uVar28;
  char cVar29;
  byte bVar30;
  int iVar31;
  int iVar32;
  uint uVar33;
  ulong uVar34;
  mz_uint mVar35;
  bool bVar36;
  byte abStack_2b8 [320];
  mz_uint8 code_sizes_to_pack [320];
  short sVar27;
  
  if (static_block == 0) {
    d->m_huff_count[0][0x100] = 1;
    tdefl_optimize_huffman_table(d,0,0x120,0xf,0);
    tdefl_optimize_huffman_table(d,1,0x20,0xf,0);
    iVar16 = 0x11f;
    lVar13 = 0x9067;
    do {
      if (lVar13 - 0x8f49U < 0x102) {
        iVar16 = 0x101;
        break;
      }
      iVar16 = iVar16 + -1;
      lVar19 = lVar13 + -0x14;
      lVar13 = lVar13 + -1;
    } while (*(char *)((long)d->m_max_probes + lVar19) == '\0');
    lVar13 = 36999;
    iVar32 = 0x1f;
    do {
      iVar31 = 1;
      if (lVar13 - 0x9069U < 2) break;
      iVar31 = iVar32 + -1;
      lVar19 = lVar13 + -0x14;
      lVar13 = lVar13 + -1;
      iVar32 = iVar31;
    } while (*(char *)((long)d->m_max_probes + lVar19) == '\0');
    memcpy(code_sizes_to_pack,d->m_huff_code_sizes,(long)iVar16);
    memcpy(code_sizes_to_pack + iVar16,d->m_huff_code_sizes + 1,(long)iVar31);
    pamVar1 = d->m_huff_count + 2;
    pamVar12 = d->m_huff_count;
    *(mz_uint16 *)((long)(pamVar12 + 2) + 0x10) = 0;
    *(mz_uint16 *)((long)(pamVar12 + 2) + 0x12) = 0;
    *(mz_uint16 *)((long)(pamVar12 + 2) + 0x14) = 0;
    *(mz_uint16 *)((long)(pamVar12 + 2) + 0x16) = 0;
    pamVar12 = d->m_huff_count;
    *(mz_uint16 *)((long)(pamVar12 + 2) + 0x18) = 0;
    *(mz_uint16 *)((long)(pamVar12 + 2) + 0x1a) = 0;
    *(mz_uint16 *)((long)(pamVar12 + 2) + 0x1c) = 0;
    *(mz_uint16 *)((long)(pamVar12 + 2) + 0x1e) = 0;
    pamVar12 = d->m_huff_count;
    *(mz_uint16 *)((long)(pamVar12 + 2) + 0x1e) = 0;
    *(mz_uint16 *)((long)(pamVar12 + 2) + 0x20) = 0;
    *(mz_uint16 *)((long)(pamVar12 + 2) + 0x22) = 0;
    *(mz_uint16 *)((long)(pamVar12 + 2) + 0x24) = 0;
    *(mz_uint16 *)((long)(d->m_huff_count + 2) + 0) = 0;
    *(mz_uint16 *)((long)(d->m_huff_count + 2) + 2) = 0;
    *(mz_uint16 *)((long)(d->m_huff_count + 2) + 4) = 0;
    *(mz_uint16 *)((long)(d->m_huff_count + 2) + 6) = 0;
    pamVar12 = d->m_huff_count;
    *(mz_uint16 *)((long)(pamVar12 + 2) + 8) = 0;
    *(mz_uint16 *)((long)(pamVar12 + 2) + 10) = 0;
    *(mz_uint16 *)((long)(pamVar12 + 2) + 0xc) = 0;
    *(mz_uint16 *)((long)(pamVar12 + 2) + 0xe) = 0;
    pmVar2 = d->m_huff_count[2] + 0x12;
    pmVar3 = d->m_huff_count[2] + 0x11;
    uVar21 = 0;
    uVar28 = 0;
    uVar17 = 0;
    uVar23 = 0;
    uVar22 = 0xff;
    while( true ) {
      bVar30 = (byte)uVar22;
      uVar33 = (uint)uVar23;
      cVar29 = (char)uVar17;
      cVar26 = (char)uVar28;
      sVar27 = (short)uVar28;
      if (uVar21 == (uint)(iVar31 + iVar16)) break;
      bVar4 = code_sizes_to_pack[uVar21];
      uVar24 = (ulong)bVar4;
      if (uVar24 == 0) {
        if (uVar28 != 0) {
          if (uVar28 < 3) {
            (*pamVar1)[uVar22] = (*pamVar1)[uVar22] + sVar27;
            while (bVar36 = uVar28 != 0, uVar28 = uVar28 - 1, bVar36) {
              abStack_2b8[uVar23] = bVar30;
              uVar23 = (ulong)((int)uVar23 + 1);
            }
          }
          else {
            pmVar15 = d->m_huff_count[2] + 0x10;
            *pmVar15 = *pmVar15 + 1;
            abStack_2b8[uVar23] = 0x10;
            uVar23 = (ulong)(uVar33 + 2);
            abStack_2b8[uVar33 + 1] = cVar26 - 3;
          }
        }
        uVar17 = uVar17 + 1;
        if (uVar17 == 0x8a) {
          *pmVar2 = *pmVar2 + 1;
          iVar32 = (int)uVar23;
          abStack_2b8[uVar23] = 0x12;
          uVar23 = (ulong)(iVar32 + 2);
          abStack_2b8[iVar32 + 1] = 0x7f;
          goto LAB_00126769;
        }
        uVar28 = 0;
      }
      else {
        uVar34 = uVar23;
        if (uVar17 != 0) {
          if (uVar17 < 3) {
            (*pamVar1)[0] = (*pamVar1)[0] + (short)uVar17;
            while (bVar36 = uVar17 != 0, uVar17 = uVar17 - 1, bVar36) {
              abStack_2b8[uVar34] = 0;
              uVar34 = (ulong)((int)uVar34 + 1);
            }
          }
          else {
            uVar34 = (ulong)(uVar33 + 2);
            bVar36 = uVar17 < 0xb;
            pmVar15 = pmVar2;
            if (bVar36) {
              pmVar15 = pmVar3;
            }
            *pmVar15 = *pmVar15 + 1;
            abStack_2b8[uVar23] = 0x12 - bVar36;
            abStack_2b8[uVar33 + 1] = (bVar36 * '\b' + cVar29) - 0xb;
          }
        }
        iVar32 = (int)uVar34;
        if (bVar4 == bVar30) {
          uVar28 = uVar28 + 1;
          uVar23 = uVar34;
          if (uVar28 == 6) {
            pmVar15 = d->m_huff_count[2] + 0x10;
            *pmVar15 = *pmVar15 + 1;
            abStack_2b8[uVar34] = 0x10;
            abStack_2b8[iVar32 + 1] = 3;
            uVar23 = (ulong)(iVar32 + 2);
            goto LAB_00126769;
          }
        }
        else {
          if (uVar28 != 0) {
            if (uVar28 < 3) {
              (*pamVar1)[uVar22] = (*pamVar1)[uVar22] + sVar27;
              while (bVar36 = uVar28 != 0, uVar28 = uVar28 - 1, bVar36) {
                abStack_2b8[uVar34] = bVar30;
                uVar34 = (ulong)((int)uVar34 + 1);
              }
            }
            else {
              pmVar15 = d->m_huff_count[2] + 0x10;
              *pmVar15 = *pmVar15 + 1;
              abStack_2b8[uVar34] = 0x10;
              uVar34 = (ulong)(iVar32 + 2);
              abStack_2b8[iVar32 + 1] = cVar26 - 3;
            }
          }
          (*pamVar1)[uVar24] = (*pamVar1)[uVar24] + 1;
          uVar23 = (ulong)((int)uVar34 + 1);
          abStack_2b8[uVar34] = bVar4;
LAB_00126769:
          uVar28 = 0;
        }
        uVar17 = 0;
      }
      uVar21 = uVar21 + 1;
      uVar22 = uVar24;
    }
    if (uVar28 == 0) {
      if (uVar17 != 0) {
        if (uVar17 < 3) {
          (*pamVar1)[0] = (*pamVar1)[0] + (short)uVar17;
          while( true ) {
            uVar33 = (uint)uVar23;
            bVar36 = uVar17 == 0;
            uVar17 = uVar17 - 1;
            if (bVar36) break;
            abStack_2b8[uVar23] = 0;
            uVar23 = (ulong)(uVar33 + 1);
          }
        }
        else {
          uVar28 = uVar33 + 1;
          uVar33 = uVar33 + 2;
          if (uVar17 < 0xb) {
            *pmVar3 = *pmVar3 + 1;
            abStack_2b8[uVar23] = 0x11;
            bVar30 = cVar29 - 3;
          }
          else {
            *pmVar2 = *pmVar2 + 1;
            abStack_2b8[uVar23] = 0x12;
            bVar30 = cVar29 - 0xb;
          }
          abStack_2b8[uVar28] = bVar30;
        }
      }
    }
    else if (uVar28 < 3) {
      (*pamVar1)[uVar22] = (*pamVar1)[uVar22] + sVar27;
      while( true ) {
        uVar33 = (uint)uVar23;
        bVar36 = uVar28 == 0;
        uVar28 = uVar28 - 1;
        if (bVar36) break;
        abStack_2b8[uVar23] = bVar30;
        uVar23 = (ulong)(uVar33 + 1);
      }
    }
    else {
      pmVar2 = d->m_huff_count[2] + 0x10;
      *pmVar2 = *pmVar2 + 1;
      uVar28 = uVar33 + 1;
      abStack_2b8[uVar23] = 0x10;
      uVar33 = uVar33 + 2;
      abStack_2b8[uVar28] = cVar26 - 3;
    }
    tdefl_optimize_huffman_table(d,2,0x13,7,0);
    uVar28 = 2 << ((byte)d->m_bits_in & 0x1f) | d->m_bit_buffer;
    d->m_bit_buffer = uVar28;
    for (uVar17 = d->m_bits_in + 2; d->m_bits_in = uVar17, 7 < uVar17; uVar17 = uVar17 - 8) {
      pmVar20 = d->m_pOutput_buf;
      if (pmVar20 < d->m_pOutput_buf_end) {
        d->m_pOutput_buf = pmVar20 + 1;
        *pmVar20 = (mz_uint8)uVar28;
        uVar17 = d->m_bits_in;
        uVar28 = d->m_bit_buffer;
      }
      uVar28 = uVar28 >> 8;
      d->m_bit_buffer = uVar28;
    }
    mVar35 = iVar16 + -0x101 << ((byte)uVar17 & 0x1f) | uVar28;
    d->m_bit_buffer = mVar35;
    for (uVar17 = uVar17 + 5; d->m_bits_in = uVar17, 7 < uVar17; uVar17 = uVar17 - 8) {
      pmVar20 = d->m_pOutput_buf;
      if (pmVar20 < d->m_pOutput_buf_end) {
        d->m_pOutput_buf = pmVar20 + 1;
        *pmVar20 = (mz_uint8)mVar35;
        uVar17 = d->m_bits_in;
        mVar35 = d->m_bit_buffer;
      }
      mVar35 = mVar35 >> 8;
      d->m_bit_buffer = mVar35;
    }
    mVar35 = iVar31 + -1 << ((byte)uVar17 & 0x1f) | mVar35;
    d->m_bit_buffer = mVar35;
    for (uVar17 = uVar17 + 5; d->m_bits_in = uVar17, 7 < uVar17; uVar17 = uVar17 - 8) {
      pmVar20 = d->m_pOutput_buf;
      if (pmVar20 < d->m_pOutput_buf_end) {
        d->m_pOutput_buf = pmVar20 + 1;
        *pmVar20 = (mz_uint8)mVar35;
        uVar17 = d->m_bits_in;
        mVar35 = d->m_bit_buffer;
      }
      mVar35 = mVar35 >> 8;
      d->m_bit_buffer = mVar35;
    }
    uVar28 = 0x12;
    while ((uVar18 = 0xffffffff, -1 < (int)uVar28 &&
           (uVar18 = uVar28, d->m_huff_code_sizes[2]["\x10\x11\x12"[uVar28]] == '\0'))) {
      uVar28 = uVar28 - 1;
    }
    if ((int)uVar18 < 4) {
      uVar18 = 3;
    }
    uVar18 = uVar18 - 3 << ((byte)uVar17 & 0x1f) | mVar35;
    d->m_bit_buffer = uVar18;
    for (uVar17 = uVar17 + 4; d->m_bits_in = uVar17, 7 < uVar17; uVar17 = uVar17 - 8) {
      pmVar20 = d->m_pOutput_buf;
      if (pmVar20 < d->m_pOutput_buf_end) {
        d->m_pOutput_buf = pmVar20 + 1;
        *pmVar20 = (mz_uint8)uVar18;
        uVar17 = d->m_bits_in;
        uVar18 = d->m_bit_buffer;
      }
      uVar18 = uVar18 >> 8;
      d->m_bit_buffer = uVar18;
    }
    uVar8 = 3;
    if (3 < (int)uVar28) {
      uVar8 = uVar28;
    }
    for (uVar22 = 0; uVar22 != uVar8 + 1; uVar22 = uVar22 + 1) {
      uVar18 = uVar18 | (uint)d->m_huff_code_sizes[2]["\x10\x11\x12"[uVar22]] <<
                        ((byte)uVar17 & 0x1f);
      d->m_bit_buffer = uVar18;
      for (uVar17 = uVar17 + 3; d->m_bits_in = uVar17, 7 < uVar17; uVar17 = uVar17 - 8) {
        pmVar20 = d->m_pOutput_buf;
        if (pmVar20 < d->m_pOutput_buf_end) {
          d->m_pOutput_buf = pmVar20 + 1;
          *pmVar20 = (mz_uint8)uVar18;
          uVar17 = d->m_bits_in;
          uVar18 = d->m_bit_buffer;
        }
        uVar18 = uVar18 >> 8;
        d->m_bit_buffer = uVar18;
      }
    }
    uVar22 = 0;
    while (uVar28 = (uint)uVar22, uVar28 < uVar33) {
      uVar23 = uVar22 & 0xffffffff;
      bVar30 = abStack_2b8[uVar23];
      bVar4 = d->m_huff_code_sizes[2][bVar30];
      uVar18 = uVar18 | (uint)d->m_huff_codes[2][bVar30] << ((byte)uVar17 & 0x1f);
      d->m_bit_buffer = uVar18;
      for (uVar17 = uVar17 + bVar4; d->m_bits_in = uVar17, 7 < uVar17; uVar17 = uVar17 - 8) {
        pmVar20 = d->m_pOutput_buf;
        if (pmVar20 < d->m_pOutput_buf_end) {
          d->m_pOutput_buf = pmVar20 + 1;
          *pmVar20 = (mz_uint8)uVar18;
          uVar17 = d->m_bits_in;
          uVar18 = d->m_bit_buffer;
        }
        uVar18 = uVar18 >> 8;
        d->m_bit_buffer = uVar18;
      }
      uVar22 = uVar23 + 1;
      if (0xf < bVar30) {
        cVar26 = "\x02\x03\a"[bVar30 - 0x10];
        uVar18 = uVar18 | (uint)abStack_2b8[uVar23 + 1] << ((byte)uVar17 & 0x1f);
        d->m_bit_buffer = uVar18;
        for (uVar17 = uVar17 + (int)cVar26; d->m_bits_in = uVar17, 7 < uVar17; uVar17 = uVar17 - 8)
        {
          pmVar20 = d->m_pOutput_buf;
          if (pmVar20 < d->m_pOutput_buf_end) {
            d->m_pOutput_buf = pmVar20 + 1;
            *pmVar20 = (mz_uint8)uVar18;
            uVar17 = d->m_bits_in;
            uVar18 = d->m_bit_buffer;
          }
          uVar18 = uVar18 >> 8;
          d->m_bit_buffer = uVar18;
        }
        uVar22 = (ulong)(uVar28 + 2);
      }
    }
  }
  else {
    for (lVar13 = 0x8f4a; (int)lVar13 != 0x8fda; lVar13 = lVar13 + 1) {
      *(undefined1 *)((long)d->m_max_probes + lVar13 + -0x14) = 8;
    }
    puVar14 = (undefined1 *)((long)d->m_max_probes + lVar13 + -0x14);
    for (iVar16 = 0x90; iVar16 != 0x100; iVar16 = iVar16 + 1) {
      *puVar14 = 9;
      puVar14 = puVar14 + 1;
    }
    for (lVar13 = 0; (int)lVar13 != 0x18; lVar13 = lVar13 + 1) {
      puVar14[lVar13] = 7;
    }
    for (lVar19 = 0; (int)lVar19 != 8; lVar19 = lVar19 + 1) {
      puVar14[lVar13 + lVar19] = 8;
    }
    pamVar11 = d->m_huff_code_sizes;
    *(mz_uint8 *)((long)(pamVar11 + 1) + 0x10) = '\x05';
    *(mz_uint8 *)((long)(pamVar11 + 1) + 0x11) = '\x05';
    *(mz_uint8 *)((long)(pamVar11 + 1) + 0x12) = '\x05';
    *(mz_uint8 *)((long)(pamVar11 + 1) + 0x13) = '\x05';
    *(mz_uint8 *)((long)(pamVar11 + 1) + 0x14) = '\x05';
    *(mz_uint8 *)((long)(pamVar11 + 1) + 0x15) = '\x05';
    *(mz_uint8 *)((long)(pamVar11 + 1) + 0x16) = '\x05';
    *(mz_uint8 *)((long)(pamVar11 + 1) + 0x17) = '\x05';
    pamVar11 = d->m_huff_code_sizes;
    *(mz_uint8 *)((long)(pamVar11 + 1) + 0x18) = '\x05';
    *(mz_uint8 *)((long)(pamVar11 + 1) + 0x19) = '\x05';
    *(mz_uint8 *)((long)(pamVar11 + 1) + 0x1a) = '\x05';
    *(mz_uint8 *)((long)(pamVar11 + 1) + 0x1b) = '\x05';
    *(mz_uint8 *)((long)(pamVar11 + 1) + 0x1c) = '\x05';
    *(mz_uint8 *)((long)(pamVar11 + 1) + 0x1d) = '\x05';
    *(mz_uint8 *)((long)(pamVar11 + 1) + 0x1e) = '\x05';
    *(mz_uint8 *)((long)(pamVar11 + 1) + 0x1f) = '\x05';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 1) + 0) = '\x05';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 1) + 1) = '\x05';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 1) + 2) = '\x05';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 1) + 3) = '\x05';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 1) + 4) = '\x05';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 1) + 5) = '\x05';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 1) + 6) = '\x05';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 1) + 7) = '\x05';
    pamVar11 = d->m_huff_code_sizes;
    *(mz_uint8 *)((long)(pamVar11 + 1) + 8) = '\x05';
    *(mz_uint8 *)((long)(pamVar11 + 1) + 9) = '\x05';
    *(mz_uint8 *)((long)(pamVar11 + 1) + 10) = '\x05';
    *(mz_uint8 *)((long)(pamVar11 + 1) + 0xb) = '\x05';
    *(mz_uint8 *)((long)(pamVar11 + 1) + 0xc) = '\x05';
    *(mz_uint8 *)((long)(pamVar11 + 1) + 0xd) = '\x05';
    *(mz_uint8 *)((long)(pamVar11 + 1) + 0xe) = '\x05';
    *(mz_uint8 *)((long)(pamVar11 + 1) + 0xf) = '\x05';
    tdefl_optimize_huffman_table(d,0,0x120,0xf,1);
    tdefl_optimize_huffman_table(d,1,0x20,0xf,1);
    uVar18 = d->m_bit_buffer | 1 << (d->m_bits_in & 0x1f);
    d->m_bit_buffer = uVar18;
    for (uVar17 = d->m_bits_in + 2; d->m_bits_in = uVar17, 7 < uVar17; uVar17 = uVar17 - 8) {
      pmVar20 = d->m_pOutput_buf;
      if (pmVar20 < d->m_pOutput_buf_end) {
        d->m_pOutput_buf = pmVar20 + 1;
        *pmVar20 = (mz_uint8)uVar18;
        uVar17 = d->m_bits_in;
        uVar18 = d->m_bit_buffer;
      }
      uVar18 = uVar18 >> 8;
      d->m_bit_buffer = uVar18;
    }
  }
  uVar22 = 1;
  for (pmVar20 = d->m_lz_code_buf; bVar30 = (byte)uVar17, pmVar20 < d->m_pLZ_code_buf;
      pmVar20 = pmVar20 + lVar13) {
    if ((int)uVar22 == 1) {
      bVar4 = *pmVar20;
      pmVar20 = pmVar20 + 1;
      uVar22 = (ulong)(bVar4 | 0x100);
    }
    bVar4 = *pmVar20;
    if ((uVar22 & 1) == 0) {
      bVar5 = d->m_huff_code_sizes[0][bVar4];
      uVar18 = uVar18 | (uint)d->m_huff_codes[0][bVar4] << (bVar30 & 0x1f);
      d->m_bit_buffer = uVar18;
      for (uVar17 = uVar17 + bVar5; d->m_bits_in = uVar17, 7 < uVar17; uVar17 = uVar17 - 8) {
        pmVar7 = d->m_pOutput_buf;
        if (pmVar7 < d->m_pOutput_buf_end) {
          d->m_pOutput_buf = pmVar7 + 1;
          *pmVar7 = (mz_uint8)uVar18;
          uVar17 = d->m_bits_in;
          uVar18 = d->m_bit_buffer;
        }
        uVar18 = uVar18 >> 8;
        d->m_bit_buffer = uVar18;
      }
      lVar13 = 1;
    }
    else {
      bVar5 = pmVar20[2];
      uVar9 = *(ushort *)(pmVar20 + 1);
      bVar6 = d->m_huff_code_sizes[0][s_tdefl_len_sym[bVar4]];
      uVar18 = uVar18 | (uint)d->m_huff_codes[0][s_tdefl_len_sym[bVar4]] << (bVar30 & 0x1f);
      d->m_bit_buffer = uVar18;
      for (uVar17 = bVar6 + uVar17; d->m_bits_in = uVar17, 7 < uVar17; uVar17 = uVar17 - 8) {
        pmVar7 = d->m_pOutput_buf;
        if (pmVar7 < d->m_pOutput_buf_end) {
          d->m_pOutput_buf = pmVar7 + 1;
          *pmVar7 = (mz_uint8)uVar18;
          uVar17 = d->m_bits_in;
          uVar18 = d->m_bit_buffer;
        }
        uVar18 = uVar18 >> 8;
        d->m_bit_buffer = uVar18;
      }
      bVar30 = ""[bVar4];
      mVar35 = (mz_bitmasks[bVar30] & (uint)bVar4) << ((byte)uVar17 & 0x1f) | uVar18;
      d->m_bit_buffer = mVar35;
      for (uVar17 = uVar17 + bVar30; d->m_bits_in = uVar17, 7 < uVar17; uVar17 = uVar17 - 8) {
        pmVar7 = d->m_pOutput_buf;
        if (pmVar7 < d->m_pOutput_buf_end) {
          d->m_pOutput_buf = pmVar7 + 1;
          *pmVar7 = (mz_uint8)mVar35;
          uVar17 = d->m_bits_in;
          mVar35 = d->m_bit_buffer;
        }
        mVar35 = mVar35 >> 8;
        d->m_bit_buffer = mVar35;
      }
      uVar28 = (uint)uVar9;
      pbVar25 = "" + bVar5;
      pbVar10 = "" + bVar5;
      if (bVar5 < 2) {
        pbVar25 = "" + uVar28;
        pbVar10 = "" + uVar28;
      }
      bVar30 = *pbVar10;
      bVar4 = d->m_huff_code_sizes[1][*pbVar25];
      mVar35 = (uint)d->m_huff_codes[1][*pbVar25] << ((byte)uVar17 & 0x1f) | mVar35;
      d->m_bit_buffer = mVar35;
      for (uVar17 = bVar4 + uVar17; d->m_bits_in = uVar17, 7 < uVar17; uVar17 = uVar17 - 8) {
        pmVar7 = d->m_pOutput_buf;
        if (pmVar7 < d->m_pOutput_buf_end) {
          d->m_pOutput_buf = pmVar7 + 1;
          *pmVar7 = (mz_uint8)mVar35;
          uVar17 = d->m_bits_in;
          mVar35 = d->m_bit_buffer;
        }
        mVar35 = mVar35 >> 8;
        d->m_bit_buffer = mVar35;
      }
      uVar18 = (uVar28 & mz_bitmasks[bVar30]) << ((byte)uVar17 & 0x1f) | mVar35;
      d->m_bit_buffer = uVar18;
      for (uVar17 = uVar17 + bVar30; d->m_bits_in = uVar17, lVar13 = 3, 7 < uVar17;
          uVar17 = uVar17 - 8) {
        pmVar7 = d->m_pOutput_buf;
        if (pmVar7 < d->m_pOutput_buf_end) {
          d->m_pOutput_buf = pmVar7 + 1;
          *pmVar7 = (mz_uint8)uVar18;
          uVar17 = d->m_bits_in;
          uVar18 = d->m_bit_buffer;
        }
        uVar18 = uVar18 >> 8;
        d->m_bit_buffer = uVar18;
      }
    }
    uVar22 = uVar22 >> 1;
  }
  bVar4 = d->m_huff_code_sizes[0][0x100];
  uVar18 = uVar18 | (uint)d->m_huff_codes[0][0x100] << (bVar30 & 0x1f);
  d->m_bit_buffer = uVar18;
  uVar17 = bVar4 + uVar17;
  while( true ) {
    d->m_bits_in = uVar17;
    pmVar20 = d->m_pOutput_buf;
    if (uVar17 < 8) break;
    if (pmVar20 < d->m_pOutput_buf_end) {
      d->m_pOutput_buf = pmVar20 + 1;
      *pmVar20 = (mz_uint8)uVar18;
      uVar17 = d->m_bits_in;
      uVar18 = d->m_bit_buffer;
    }
    uVar18 = uVar18 >> 8;
    d->m_bit_buffer = uVar18;
    uVar17 = uVar17 - 8;
  }
  return (uint)(pmVar20 < d->m_pOutput_buf_end);
}

Assistant:

static mz_bool tdefl_compress_block(tdefl_compressor *d, mz_bool static_block) {
  if (static_block)
    tdefl_start_static_block(d);
  else
    tdefl_start_dynamic_block(d);
  return tdefl_compress_lz_codes(d);
}